

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

Instr * Peeps::CleanupLabel(LabelInstr *instr,LabelInstr *instrNext)

{
  code *pcVar1;
  bool bVar2;
  Type *ppBVar3;
  undefined4 *puVar4;
  LabelInstr *pLStack_38;
  bool replaced;
  LabelInstr *labelToKeep;
  LabelInstr *labelToRemove;
  Instr *returnInstr;
  LabelInstr *instrNext_local;
  LabelInstr *instr_local;
  
  if (((instrNext->field_0x78 & 1) == 0) && (((byte)instrNext->field_0x78 >> 2 & 1) == 0)) {
    labelToRemove = (LabelInstr *)(instrNext->super_Instr).m_next;
    labelToKeep = instrNext;
    pLStack_38 = instr;
  }
  else {
    if ((instr->field_0x78 & 1) != 0) {
      return &instrNext->super_Instr;
    }
    labelToRemove = instrNext;
    labelToKeep = instr;
    pLStack_38 = instrNext;
    if (((byte)instr->field_0x78 >> 2 & 1) != 0) {
      return &instrNext->super_Instr;
    }
  }
  while( true ) {
    do {
      bVar2 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                        ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                         &labelToKeep->labelRefs);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        if ((((byte)labelToKeep->field_0x78 >> 1 & 1) != 0) &&
           (pLStack_38->field_0x78 = pLStack_38->field_0x78 & 0xfd | 2,
           ((byte)labelToKeep->field_0x78 >> 5 & 1) != 0)) {
          pLStack_38->field_0x78 = pLStack_38->field_0x78 & 0xdf | 0x20;
        }
        IR::Instr::Remove(&labelToKeep->super_Instr);
        return &labelToRemove->super_Instr;
      }
      ppBVar3 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                          ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                           &labelToKeep->labelRefs);
      bVar2 = IR::BranchInstr::ReplaceTarget(*ppBVar3,labelToKeep,pLStack_38);
    } while (bVar2);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x3f7,"(replaced)","replaced");
    if (!bVar2) break;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

IR::Instr *
Peeps::CleanupLabel(IR::LabelInstr * instr, IR::LabelInstr * instrNext)
{
    IR::Instr * returnInstr;

    IR::LabelInstr * labelToRemove;
    IR::LabelInstr * labelToKeep;

    // Just for dump, always keep loop top labels
    // We also can remove label that has non branch references
    if (instrNext->m_isLoopTop || instrNext->m_hasNonBranchRef)
    {
        if (instr->m_isLoopTop || instr->m_hasNonBranchRef)
        {
            // Don't remove loop top labels or labels with non branch references
            return instrNext;
        }
        labelToRemove = instr;
        labelToKeep = instrNext;
        returnInstr = instrNext;
    }
    else
    {
        labelToRemove = instrNext;
        labelToKeep = instr;
        returnInstr = instrNext->m_next;
    }
    while (!labelToRemove->labelRefs.Empty())
    {
        bool replaced = labelToRemove->labelRefs.Head()->ReplaceTarget(labelToRemove, labelToKeep);
        Assert(replaced);
    }

    if (labelToRemove->isOpHelper)
    {
        labelToKeep->isOpHelper = true;
#if DBG
        if (labelToRemove->m_noHelperAssert)
        {
            labelToKeep->m_noHelperAssert = true;
        }
#endif
    }

    labelToRemove->Remove();
    return returnInstr;
}